

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
* __thiscall
cfd::core::ConfidentialTransaction::GetTxOutList
          (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           *__return_storage_ptr__,ConfidentialTransaction *this)

{
  pointer pCVar1;
  pointer pCVar2;
  ConfidentialTxOut tx_out;
  ConfidentialTxOutReference CStack_218;
  ConfidentialTxOut local_120;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->vout_).
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    ConfidentialTxOut::ConfidentialTxOut(&local_120,pCVar2);
    ConfidentialTxOutReference::ConfidentialTxOutReference(&CStack_218,&local_120);
    ::std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::emplace_back<cfd::core::ConfidentialTxOutReference>(__return_storage_ptr__,&CStack_218);
    ConfidentialTxOutReference::~ConfidentialTxOutReference(&CStack_218);
    ConfidentialTxOut::~ConfidentialTxOut(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<ConfidentialTxOutReference>  // force LF
ConfidentialTransaction::GetTxOutList() const {
  std::vector<ConfidentialTxOutReference> refs;
  for (ConfidentialTxOut tx_out : vout_) {
    refs.push_back(ConfidentialTxOutReference(tx_out));
  }
  return refs;
}